

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECDecoding.cpp
# Opt level: O1

void do_decode(string *inp,FreqTable *freqs,unordered_map<string,_char2double> *tMap,
              unordered_map<string,_vector<string>_> *motif,json *config,int *codewordLen,
              list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *results,mutex *res_lock)

{
  size_t *psVar1;
  pointer pcVar2;
  _Node *p_Var3;
  string metric_str;
  SeqEntry dec;
  ECdecoding ecDec;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  unordered_map<string,_vector<string>_> *local_500;
  string local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  undefined1 local_4b8 [184];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_400 [17];
  ECdecoding local_258;
  
  local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
  local_500 = motif;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"ERR","");
  local_538.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_538.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_538.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (inp->_M_dataplus)._M_p;
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4f8,pcVar2,pcVar2 + inp->_M_string_length);
  ECdecoding::ECdecoding(&local_258,&local_4f8,freqs,tMap,true,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  ECdecoding::decode((SeqEntry *)local_4b8,&local_258,*codewordLen,local_500,config);
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_4d8,vsnprintf,0x148,"%f",local_4b8._0_8_);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_520,&local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_538,local_400);
  SeqEntry::~SeqEntry((SeqEntry *)local_4b8);
  ECdecoding::~ECdecoding(&local_258);
  local_4b8._0_8_ = res_lock;
  local_4b8[8] = false;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_4b8);
  local_4b8[8] = true;
  p_Var3 = std::__cxx11::
           list<std::tuple<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::tuple<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
           ::
           _M_create_node<std::__cxx11::string&,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                     ((list<std::tuple<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::tuple<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                       *)results,&local_520,&local_538);
  std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
  psVar1 = &(results->
            super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_4b8);
  if (local_538.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_538.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_538.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_538.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void do_decode(const string &inp, FreqTable &freqs, robin_hood::unordered_map<string, char2double> &tMap, robin_hood::unordered_map<string, vector<string>> &motif,
               nlohmann::json &config, int &codewordLen, list<tuple<string, vector<unsigned char>>> &results, std::mutex *res_lock) {
    string metric_str = "ERR";
    vector<unsigned char> data = {};
    try {
        ECdecoding ecDec = ECdecoding(inp, freqs, tMap, true, config);
        SeqEntry dec = ecDec.decode(codewordLen, motif, config);
        metric_str = to_string(dec.metric);
        data = *dec.ac.bitout.get_data();
    }
    catch (...) {
        WARN("No candidate found.");
    }
    {
        std::unique_lock<std::mutex> uLock(*res_lock);
        results.emplace_back(metric_str, data);
    }
}